

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O0

void mp::WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::LinTerms>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *algc,ItemNamer *vnam)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *in_RSI;
  char *in_RDI;
  double dVar1;
  double dVar2;
  BasicWriter<char> *this;
  BasicWriter<char> BVar3;
  AlgConRange *rng;
  char *in_stack_ffffffffffffff58;
  BasicStringRef<char> *in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff78;
  char *value_02;
  BasicWriter<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  BasicWriter<char> *in_stack_ffffffffffffff90;
  MemoryWriter *wrt_00;
  
  BVar3 = (BasicWriter<char>)
          AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::GetRhsOrRange(in_RSI);
  wrt_00 = (MemoryWriter *)&stack0xffffffffffffffd0;
  dVar1 = AlgConRange::lb((AlgConRange *)wrt_00);
  if (-1.79769313486232e+308 < dVar1) {
    dVar1 = AlgConRange::lb((AlgConRange *)wrt_00);
    dVar2 = AlgConRange::ub((AlgConRange *)wrt_00);
    if (dVar1 < dVar2) {
      in_stack_ffffffffffffff88 = in_RDI;
      AlgConRange::lb((AlgConRange *)wrt_00);
      in_stack_ffffffffffffff90 =
           fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
      ;
      value.size_ = (size_t)in_stack_ffffffffffffff90;
      value.data_ = in_stack_ffffffffffffff88;
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff80,value);
    }
  }
  value_02 = in_RDI;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::GetBody(in_RSI);
  WriteModelItem(wrt_00,(LinTerms *)BVar3.buffer_,(ItemNamer *)BVar3._vptr_BasicWriter);
  this = (BasicWriter<char> *)AlgConRange::lb((AlgConRange *)wrt_00);
  dVar1 = AlgConRange::ub((AlgConRange *)wrt_00);
  if (((double)this != dVar1) || (NAN((double)this) || NAN(dVar1))) {
    dVar1 = AlgConRange::ub((AlgConRange *)wrt_00);
    if (dVar1 < 1.79769313486232e+308) {
      fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffff60,in_RDI);
      value_01.size_ = (size_t)in_stack_ffffffffffffff90;
      value_01.data_ = in_stack_ffffffffffffff88;
      fmt::BasicWriter<char>::operator<<(this,value_01);
      AlgConRange::ub((AlgConRange *)wrt_00);
      fmt::BasicWriter<char>::operator<<(this,(double)value_02);
    }
  }
  else {
    fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    value_00.size_ = (size_t)in_stack_ffffffffffffff90;
    value_00.data_ = in_stack_ffffffffffffff88;
    fmt::BasicWriter<char>::operator<<(this,value_00);
    AlgConRange::lb((AlgConRange *)wrt_00);
    fmt::BasicWriter<char>::operator<<(this,(double)value_02);
  }
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt,
                    const AlgebraicConstraint<Body, AlgConRange>& algc,
                    ItemNamer& vnam) {
  const auto& rng = algc.GetRhsOrRange();
  if (rng.lb() > -DBL_MAX && rng.lb() < rng.ub())
    wrt << rng.lb() << " <= ";
  WriteModelItem(wrt, algc.GetBody(), vnam);
  if (rng.lb() == rng.ub())
    wrt << " == " << rng.lb();
  else if (rng.ub() < DBL_MAX)
    wrt << " <= " << rng.ub();
}